

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_merge_overlap
              (char *tile,int pixlen,int ndim,long *tfpixel,long *tlpixel,char *bnullarray,
              char *image,long *fpixel,long *lpixel,int nullcheck,int *status)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  char *__src;
  long lVar18;
  char *__dest;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_290;
  long tiledim [6];
  long imgdim [6];
  long tilefpix [6];
  long inc [6];
  long imglpix [6];
  long imgfpix [6];
  
  iVar9 = *status;
  if (iVar9 < 1) {
    for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 8) {
      *(undefined8 *)((long)inc + lVar3) = 1;
      *(undefined8 *)((long)imgdim + lVar3) = 1;
      *(undefined8 *)((long)imgfpix + lVar3) = 0;
      *(undefined8 *)((long)tiledim + lVar3) = 1;
      *(undefined8 *)((long)imglpix + lVar3) = 0;
      *(undefined8 *)((long)tilefpix + lVar3) = 0;
    }
    uVar13 = 0;
    if (0 < ndim) {
      uVar13 = (ulong)(uint)ndim;
    }
    for (uVar20 = 0; uVar20 != uVar13; uVar20 = uVar20 + 1) {
      lVar3 = tlpixel[uVar20];
      lVar10 = fpixel[uVar20];
      if (lVar3 < lVar10) {
        return iVar9;
      }
      lVar15 = tfpixel[uVar20];
      if (lpixel[uVar20] < lVar15) {
        return iVar9;
      }
      lVar4 = inc[uVar20];
      lVar11 = -lVar4;
      if (0 < lVar4) {
        lVar11 = lVar4;
      }
      lVar4 = (lpixel[uVar20] - lVar10) / lVar11;
      imgdim[uVar20] = lVar4 + 1;
      if (lVar4 < 0) {
LAB_001c2dc8:
        *status = 0x143;
        return 0x143;
      }
      lVar5 = (lVar3 - lVar15) + 1;
      tiledim[uVar20] = lVar5;
      if (lVar3 - lVar15 < 0) goto LAB_001c2dc8;
      if (uVar20 != 0) {
        tiledim[uVar20] = lVar5 * tiledim[uVar20 - 1];
      }
      lVar16 = lVar15 - lVar10;
      lVar5 = lVar15 + -1;
      while (lVar16 % lVar11 != 0) {
        lVar16 = lVar16 + 1;
        bVar1 = lVar3 + -1 <= lVar5;
        lVar5 = lVar5 + 1;
        if (bVar1) {
          return iVar9;
        }
      }
      while ((lVar3 - lVar10) % lVar11 != 0) {
        lVar3 = lVar3 + -1;
        if (lVar3 <= lVar5) {
          return iVar9;
        }
      }
      lVar16 = lVar16 / lVar11;
      if (lVar16 < 1) {
        lVar16 = 0;
      }
      imgfpix[uVar20] = lVar16;
      lVar5 = (lVar3 - lVar10) / lVar11;
      lVar3 = lVar4;
      if (lVar5 < lVar4) {
        lVar3 = lVar5;
      }
      imglpix[uVar20] = lVar3;
      lVar3 = lVar10 - lVar15;
      if (lVar3 < 1) {
        lVar3 = 0;
      }
      while (((lVar15 - lVar10) + lVar3) % lVar11 != 0) {
        lVar3 = lVar3 + 1;
        if (tiledim[uVar20] <= lVar3) {
          tilefpix[uVar20] = lVar3;
          return iVar9;
        }
      }
      tilefpix[uVar20] = lVar3;
      if (uVar20 != 0) {
        imgdim[uVar20] = (lVar4 + 1) * tiledim[uVar20 + 5];
      }
    }
    iVar9 = 1;
    if (inc[0] == 1) {
      iVar9 = ((int)imglpix[0] - (int)imgfpix[0]) + 1;
    }
    lVar10 = (long)iVar9;
    lVar3 = -inc[4];
    if (0 < inc[4]) {
      lVar3 = inc[4];
    }
    lVar15 = -inc[3];
    if (0 < inc[3]) {
      lVar15 = inc[3];
    }
    lVar4 = -inc[2];
    if (0 < inc[2]) {
      lVar4 = inc[2];
    }
    lVar11 = -inc[1];
    if (0 < inc[1]) {
      lVar11 = inc[1];
    }
    lVar16 = -lVar10;
    lVar5 = ~imgfpix[0] + imgdim[0];
    if (0 < inc[0]) {
      lVar16 = lVar10;
      lVar5 = imgfpix[0];
    }
    lVar21 = -inc[0];
    if (inc[0] != lVar21 && SBORROW8(inc[0],lVar21) == inc[0] * 2 < 0) {
      lVar21 = inc[0];
    }
    lVar6 = (long)pixlen;
    local_2f0 = 0;
    for (lVar14 = 0; lVar18 = local_2f0, lVar14 <= imglpix[4] - imgfpix[4]; lVar14 = lVar14 + 1) {
      for (; (lVar7 = local_2f0, 4 < ndim &&
             (lVar7 = lVar18, ((tfpixel[4] - fpixel[4]) + tilefpix[4] + lVar18) % lVar3 != 0));
          lVar18 = lVar18 + 1) {
      }
      local_2f0 = lVar7;
      if (inc[4] < 1) {
        local_290 = imgdim[4] - (imgfpix[4] + lVar14 + 1) * imgdim[3];
      }
      else {
        local_290 = (imgfpix[4] + lVar14) * imgdim[3];
      }
      local_2e8 = 0;
      for (lVar18 = 0; lVar7 = local_2e8, lVar18 <= imglpix[3] - imgfpix[3]; lVar18 = lVar18 + 1) {
        for (; (lVar19 = local_2e8, 3 < ndim &&
               (lVar19 = lVar7, ((tfpixel[3] - fpixel[3]) + tilefpix[3] + lVar7) % lVar15 != 0));
            lVar7 = lVar7 + 1) {
        }
        local_2e8 = lVar19;
        if (inc[3] < 1) {
          lVar7 = imgdim[3] - (imgfpix[3] + lVar18 + 1) * imgdim[2];
        }
        else {
          lVar7 = (imgfpix[3] + lVar18) * imgdim[2];
        }
        local_2e0 = 0;
        for (lVar19 = 0; lVar12 = local_2e0, lVar19 <= imglpix[2] - imgfpix[2]; lVar19 = lVar19 + 1)
        {
          for (; (lVar8 = local_2e0, 2 < ndim &&
                 (lVar8 = lVar12, ((tfpixel[2] - fpixel[2]) + tilefpix[2] + lVar12) % lVar4 != 0));
              lVar12 = lVar12 + 1) {
          }
          local_2e0 = lVar8;
          if (inc[2] < 1) {
            lVar12 = imgdim[2] - (imgfpix[2] + lVar19 + 1) * imgdim[1];
          }
          else {
            lVar12 = (imgfpix[2] + lVar19) * imgdim[1];
          }
          local_2d8 = 0;
          for (lVar8 = 0; lVar17 = local_2d8, lVar8 <= imglpix[1] - imgfpix[1]; lVar8 = lVar8 + 1) {
            for (; (lVar2 = local_2d8, 1 < ndim &&
                   (lVar2 = lVar17, ((tfpixel[1] - fpixel[1]) + tilefpix[1] + lVar17) % lVar11 != 0)
                   ); lVar17 = lVar17 + 1) {
            }
            local_2d8 = lVar2;
            if (inc[1] < 1) {
              lVar17 = imgdim[1] - (imgfpix[1] + lVar8 + 1) * imgdim[0];
            }
            else {
              lVar17 = (imgfpix[1] + lVar8) * imgdim[0];
            }
            __dest = tile + ((tilefpix[1] + local_2d8) * tiledim[0] +
                            (tilefpix[2] + local_2e0) * tiledim[1] +
                            (tilefpix[3] + local_2e8) * tiledim[2] +
                            (tilefpix[4] + local_2f0) * tiledim[3] + tilefpix[0]) * lVar6;
            __src = image + (lVar17 + lVar12 + lVar7 + local_290 + lVar5) * lVar6;
            for (lVar17 = imgfpix[0]; lVar17 <= imglpix[0]; lVar17 = lVar17 + lVar10) {
              memcpy(__dest,__src,(long)(iVar9 * pixlen));
              __dest = __dest + lVar21 * lVar6 * lVar10;
              __src = __src + lVar16 * lVar6;
            }
            local_2d8 = local_2d8 + 1;
          }
          local_2e0 = local_2e0 + 1;
        }
        local_2e8 = local_2e8 + 1;
      }
      local_2f0 = local_2f0 + 1;
    }
    iVar9 = *status;
  }
  return iVar9;
}

Assistant:

int imcomp_merge_overlap (
    char *tile,         /* O - multi dimensional array of tile pixels */
    int pixlen,         /* I - number of bytes in each tile or image pixel */
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    char *bnullarray,   /* I - array of null flags; used if nullcheck = 2 */
    char *image,        /* I - multi dimensional output image */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    int nullcheck,      /* I - 0, 1: do nothing; 2: set nullarray for nulls */
    int *status)

/* 
  Similar to imcomp_copy_overlap, except it copies the overlapping pixels from
  the 'image' to the 'tile'.
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    long i1, i2, i3, i4;   /* offset along each axis of the image */
    long it1, it2, it3, it4;
    long im1, im2, im3, im4;  /* offset to image pixel, allowing for inc */
    long ipos, tf, tl;
    long t2, t3, t4;   /* offset along each axis of the tile */
    long tilepix, imgpix, tilepixbyte, imgpixbyte;
    int ii, overlap_bytes, overlap_flags;

    if (*status > 0)
        return(*status);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        /* set default values for higher dimensions */
        inc[ii] = 1;
        imgdim[ii] = 1;
        tiledim[ii] = 1;
        imgfpix[ii] = 0;
        imglpix[ii] = 0;
        tilefpix[ii] = 0;
    }

    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(*status);  /* there are no overlapping pixels */

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1)
            return(*status = NEG_AXIS);

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1)
            return(*status = NEG_AXIS);

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(*status);  /* no overlapping pixels */
        }
/*
printf("ii tfpixel, tlpixel %d %d %d \n",ii, tfpixel[ii], tlpixel[ii]);
printf("ii, tf, tl, imgfpix,imglpix, tilefpix %d %d %d %d %d %d\n",ii,
 tf,tl,imgfpix[ii], imglpix[ii],tilefpix[ii]);
*/
        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    /* ---------------------------------------------------------------- */
    /* calc number of pixels in each row (first dimension) that overlap */
    /* multiply by pixlen to get number of bytes to copy in each loop   */
    /* ---------------------------------------------------------------- */

    if (inc[0] != 1)
       overlap_flags = 1;  /* can only copy 1 pixel at a time */
    else
       overlap_flags = imglpix[0] - imgfpix[0] + 1;  /* can copy whole row */

    overlap_bytes = overlap_flags * pixlen;

    /* support up to 5 dimensions for now */
    for (i4 = 0, it4=0; i4 <= imglpix[4] - imgfpix[4]; i4++, it4++)
    {
     /* increment plane if it falls in the cracks of the subsampled image */
     while (ndim > 4 &&  (tfpixel[4] + tilefpix[4] - fpixel[4] + it4)
                          % labs(inc[4]) != 0)
        it4++;

       /* offset to start of hypercube */
       if (inc[4] > 0)
          im4 = (i4 + imgfpix[4]) * imgdim[3];
       else
          im4 = imgdim[4] - (i4 + 1 + imgfpix[4]) * imgdim[3];

      t4 = (tilefpix[4] + it4) * tiledim[3];
      for (i3 = 0, it3=0; i3 <= imglpix[3] - imgfpix[3]; i3++, it3++)
      {
       /* increment plane if it falls in the cracks of the subsampled image */
       while (ndim > 3 &&  (tfpixel[3] + tilefpix[3] - fpixel[3] + it3)
                            % labs(inc[3]) != 0)
          it3++;

       /* offset to start of cube */
       if (inc[3] > 0)
          im3 = (i3 + imgfpix[3]) * imgdim[2] + im4;
       else
          im3 = imgdim[3] - (i3 + 1 + imgfpix[3]) * imgdim[2] + im4;

       t3 = (tilefpix[3] + it3) * tiledim[2] + t4;

       /* loop through planes of the image */
       for (i2 = 0, it2=0; i2 <= imglpix[2] - imgfpix[2]; i2++, it2++)
       {
          /* incre plane if it falls in the cracks of the subsampled image */
          while (ndim > 2 &&  (tfpixel[2] + tilefpix[2] - fpixel[2] + it2)
                               % labs(inc[2]) != 0)
             it2++;

          /* offset to start of plane */
          if (inc[2] > 0)
             im2 = (i2 + imgfpix[2]) * imgdim[1] + im3;
          else
             im2 = imgdim[2] - (i2 + 1 + imgfpix[2]) * imgdim[1] + im3;

          t2 = (tilefpix[2] + it2) * tiledim[1] + t3;

          /* loop through rows of the image */
          for (i1 = 0, it1=0; i1 <= imglpix[1] - imgfpix[1]; i1++, it1++)
          {
             /* incre row if it falls in the cracks of the subsampled image */
             while (ndim > 1 &&  (tfpixel[1] + tilefpix[1] - fpixel[1] + it1)
                                  % labs(inc[1]) != 0)
                it1++;

             /* calc position of first pixel in tile to be copied */
             tilepix = tilefpix[0] + (tilefpix[1] + it1) * tiledim[0] + t2;

             /* offset to start of row */
             if (inc[1] > 0)
                im1 = (i1 + imgfpix[1]) * imgdim[0] + im2;
             else
                im1 = imgdim[1] - (i1 + 1 + imgfpix[1]) * imgdim[0] + im2;
/*
printf("inc = %d %d %d %d\n",inc[0],inc[1],inc[2],inc[3]);
printf("im1,im2,im3,im4 = %d %d %d %d\n",im1,im2,im3,im4);
*/
             /* offset to byte within the row */
             if (inc[0] > 0)
                imgpix = imgfpix[0] + im1;
             else
                imgpix = imgdim[0] - 1 - imgfpix[0] + im1;
/*
printf("tilefpix0,1, imgfpix1, it1, inc1, t2= %d %d %d %d %d %d\n",
       tilefpix[0],tilefpix[1],imgfpix[1],it1,inc[1], t2);
printf("i1, it1, tilepix, imgpix %d %d %d %d \n", i1, it1, tilepix, imgpix);
*/
             /* loop over pixels along one row of the image */
             for (ipos = imgfpix[0]; ipos <= imglpix[0]; ipos += overlap_flags)
             {
               /* convert from image pixel to byte offset */
               tilepixbyte = tilepix * pixlen;
               imgpixbyte  = imgpix  * pixlen;
/*
printf("  tilepix, tilepixbyte, imgpix, imgpixbyte= %d %d %d %d\n",
          tilepix, tilepixbyte, imgpix, imgpixbyte);
*/
               /* copy overlapping row of pixels from image to tile */
               memcpy(tile + tilepixbyte, image + imgpixbyte,  overlap_bytes);

               tilepix += (overlap_flags * labs(inc[0]));
               if (inc[0] > 0)
                 imgpix += overlap_flags;
               else
                 imgpix -= overlap_flags;
            }
          }
        }
      }
    }
    return(*status);
}